

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortDnaSequence.cpp
# Opt level: O1

ShortDnaSequence * __thiscall
ShortDnaSequence::reverseComplement(ShortDnaSequence *__return_storage_ptr__,ShortDnaSequence *this)

{
  string_ptr_t *forward;
  byte bVar1;
  size_type sVar2;
  element_type *peVar3;
  shared_count sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  element_type *peVar11;
  char cVar12;
  element_type *local_48;
  shared_count sStack_40;
  element_type *local_38;
  shared_count sStack_30;
  
  forward = &this->backward;
  if ((this->backward).px == (element_type *)0x0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    sVar2 = ((this->forward).px)->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)&pbVar5->field_2;
    std::__cxx11::string::_M_construct((ulong)pbVar5,(char)sVar2);
    boost::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string>
              ((shared_ptr<std::__cxx11::string> *)&local_48,pbVar5);
    sVar4.pi_ = sStack_40.pi_;
    peVar11 = local_48;
    local_48 = (element_type *)0x0;
    sStack_40.pi_ = (sp_counted_base *)0x0;
    local_38 = (this->backward).px;
    sStack_30.pi_ = (this->backward).pn.pi_;
    (this->backward).px = peVar11;
    (this->backward).pn.pi_ = sVar4.pi_;
    boost::detail::shared_count::~shared_count(&sStack_30);
    boost::detail::shared_count::~shared_count(&sStack_40);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    sVar2 = ((this->forward).px)->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)&pbVar5->field_2;
    std::__cxx11::string::_M_construct((ulong)pbVar5,(char)sVar2);
    boost::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string>
              ((shared_ptr<std::__cxx11::string> *)&local_48,pbVar5);
    sVar4.pi_ = sStack_40.pi_;
    peVar11 = local_48;
    local_48 = (element_type *)0x0;
    sStack_40.pi_ = (sp_counted_base *)0x0;
    local_38 = (this->backward_qualities).px;
    sStack_30.pi_ = (this->backward_qualities).pn.pi_;
    (this->backward_qualities).px = peVar11;
    (this->backward_qualities).pn.pi_ = sVar4.pi_;
    boost::detail::shared_count::~shared_count(&sStack_30);
    boost::detail::shared_count::~shared_count(&sStack_40);
    if (((this->forward).px)->_M_string_length != 0) {
      iVar7 = (int)((this->forward).px)->_M_string_length;
      uVar9 = 0;
      do {
        iVar7 = iVar7 + -1;
        peVar11 = (this->forward_qualities).px;
        uVar10 = uVar9;
        if (peVar11->_M_string_length <= uVar9) goto LAB_00177708;
        peVar3 = (this->backward_qualities).px;
        uVar6 = (ulong)iVar7;
        uVar10 = uVar6;
        if (peVar3->_M_string_length <= uVar6) goto LAB_00177708;
        (peVar3->_M_dataplus)._M_p[uVar6] = (peVar11->_M_dataplus)._M_p[uVar9];
        peVar11 = (this->forward).px;
        uVar10 = uVar9;
        if (peVar11->_M_string_length <= uVar9) goto LAB_00177708;
        bVar1 = (peVar11->_M_dataplus)._M_p[uVar9];
        if (bVar1 < 0x47) {
          if (bVar1 == 0x41) {
            peVar11 = forward->px;
            uVar8 = peVar11->_M_string_length;
            cVar12 = 'T';
            goto LAB_001776ac;
          }
          if (bVar1 == 0x43) {
            peVar11 = forward->px;
            uVar8 = peVar11->_M_string_length;
            cVar12 = 'G';
            goto LAB_001776ac;
          }
        }
        else {
          if (bVar1 == 0x47) {
            peVar11 = forward->px;
            uVar8 = peVar11->_M_string_length;
            cVar12 = 'C';
          }
          else if (bVar1 == 0x4e) {
            peVar11 = forward->px;
            uVar8 = peVar11->_M_string_length;
            cVar12 = 'N';
          }
          else {
            if (bVar1 != 0x54) goto LAB_001776b8;
            peVar11 = forward->px;
            uVar8 = peVar11->_M_string_length;
            cVar12 = 'A';
          }
LAB_001776ac:
          uVar10 = uVar6;
          if (uVar8 <= uVar6) {
LAB_00177708:
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar10)
            ;
          }
          (peVar11->_M_dataplus)._M_p[uVar6] = cVar12;
        }
LAB_001776b8:
        uVar9 = uVar9 + 1;
      } while (uVar9 < ((this->forward).px)->_M_string_length);
    }
  }
  ShortDnaSequence(__return_storage_ptr__,forward,&this->backward_qualities,&this->forward,
                   &this->forward_qualities);
  return __return_storage_ptr__;
}

Assistant:

ShortDnaSequence ShortDnaSequence::reverseComplement() const {
	// cerr << "ShortDnaSequence::reverseComplement()"  << endl;
	if (backward.get() == 0) {
		backward = string_ptr_t(new string(forward->size(),' '));
		backward_qualities = string_ptr_t(new string(forward->size(),' '));
		int b_pos = forward->size()-1;
		for (size_t i=0; i<forward->size(); ++i, --b_pos) {
			backward_qualities->at(b_pos) = forward_qualities->at(i);
			switch (forward->at(i)) {
			case 'A':
				backward->at(b_pos) = 'T';
				break;
			case 'C':
				backward->at(b_pos) = 'G';
				break;
			case 'G':
				backward->at(b_pos) = 'C';
				break;
			case 'T':
				backward->at(b_pos) = 'A';
				break;
			case 'N':
				backward->at(b_pos) = 'N';
				break;
			default:
				assert(false);
			}
		}
		// cerr << "Computed revcomp: " << *backward << endl;
	}
	return ShortDnaSequence(backward, backward_qualities, forward, forward_qualities);
}